

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiWindow *pIVar5;
  long lVar6;
  ImGuiWindow *this;
  bool bVar7;
  ImRect IVar8;
  
  pIVar4 = GImGui;
  if (((GImGui->ActiveId == 0) && (GImGui->HoveredId == 0)) &&
     ((pIVar5 = GImGui->NavWindow, pIVar5 == (ImGuiWindow *)0x0 || (pIVar5->Appearing == false)))) {
    if ((GImGui->IO).MouseClicked[0] == true) {
      pIVar3 = GImGui->HoveredWindow;
      if (pIVar3 == (ImGuiWindow *)0x0) {
        this = (ImGuiWindow *)0x0;
      }
      else {
        this = pIVar3->RootWindowDockStop;
      }
      if (this == (ImGuiWindow *)0x0) {
        if (pIVar5 != (ImGuiWindow *)0x0) {
          pIVar5 = GetTopMostPopupModal();
          if (pIVar5 == (ImGuiWindow *)0x0) {
            FocusWindow((ImGuiWindow *)0x0);
          }
        }
      }
      else {
        StartMouseMovingWindow(pIVar3);
        if (((pIVar4->IO).ConfigWindowsMoveFromTitleBarOnly == true) &&
           (((this->Flags & 1) == 0 || ((this->field_0x43a & 1) != 0)))) {
          IVar8 = ImGuiWindow::TitleBarRect(this);
          fVar1 = (pIVar4->IO).MouseClickedPos[0].x;
          if ((fVar1 < IVar8.Min.x) ||
             (((fVar2 = (pIVar4->IO).MouseClickedPos[0].y, fVar2 < IVar8.Min.y ||
               (IVar8.Max.x <= fVar1)) || (IVar8.Max.y <= fVar2)))) {
            pIVar4->MovingWindow = (ImGuiWindow *)0x0;
          }
        }
      }
    }
    if ((pIVar4->IO).MouseClicked[1] == true) {
      pIVar5 = GetTopMostPopupModal();
      bVar7 = pIVar5 == (ImGuiWindow *)0x0;
      lVar6 = (long)(pIVar4->Windows).Size;
      do {
        if ((lVar6 < 1) || (bVar7)) break;
        pIVar3 = (pIVar4->Windows).Data[lVar6 + -1];
        if (pIVar3 != pIVar5) {
          if (pIVar3 == pIVar4->HoveredWindow) {
            bVar7 = true;
          }
        }
        lVar6 = lVar6 + -1;
      } while (pIVar3 != pIVar5);
      if (bVar7) {
        pIVar5 = pIVar4->HoveredWindow;
      }
      ClosePopupsOverWindow(pIVar5,true);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click on void to focus window and start moving
    // (after we're done with all our widgets, so e.g. clicking on docking tab-bar which have set HoveredId already and not get us here!)
    if (g.IO.MouseClicked[0])
    {
        ImGuiWindow* root_window = g.HoveredWindow ? g.HoveredWindow->RootWindowDockStop : NULL;
        if (root_window != NULL)
        {
            StartMouseMovingWindow(g.HoveredWindow);
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly)
                if (!(root_window->Flags & ImGuiWindowFlags_NoTitleBar) || root_window->DockIsActive)
                    if (!root_window->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                        g.MovingWindow = NULL;
        }
        else if (g.NavWindow != NULL && GetTopMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the top-most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetTopMostPopupModal();
        bool hovered_window_above_modal = false;
        if (modal == NULL)
            hovered_window_above_modal = true;
        for (int i = g.Windows.Size - 1; i >= 0 && hovered_window_above_modal == false; i--)
        {
            ImGuiWindow* window = g.Windows[i];
            if (window == modal)
                break;
            if (window == g.HoveredWindow)
                hovered_window_above_modal = true;
        }
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}